

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointPoint.cpp
# Opt level: O3

ChVectorDynamic<> __thiscall
chrono::fea::ChLinkPointPoint::GetConstraintViolation(ChLinkPointPoint *this)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *pvVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long in_RSI;
  ChVectorDynamic<> CVar8;
  
  auVar3 = *(undefined1 (*) [16])(*(long *)(in_RSI + 600) + 0x20);
  auVar4 = *(undefined1 (*) [16])(*(long *)(in_RSI + 0x268) + 0x20);
  dVar1 = *(double *)(*(long *)(in_RSI + 600) + 0x30);
  dVar2 = *(double *)(*(long *)(in_RSI + 0x268) + 0x30);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)SUB168(ZEXT816(0) << 0x20,0);
  (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus =
       (_Alloc_hider)SUB168(ZEXT816(0) << 0x20,8);
  pvVar5 = malloc(0x58);
  if (pvVar5 != (void *)0x0) {
    uVar7 = (ulong)pvVar5 & 0xffffffffffffffc0;
    auVar3 = vsubpd_avx(auVar3,auVar4);
    *(void **)(uVar7 + 0x38) = pvVar5;
    (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
         (_func_int **)(uVar7 + 0x40);
    (this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj.m_name._M_dataplus._M_p = (pointer)0x3;
    *(undefined1 (*) [16])(uVar7 + 0x40) = auVar3;
    *(double *)(uVar7 + 0x50) = dVar1 - dVar2;
    CVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)(uVar7 + 0x40);
    CVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)this;
    return (ChVectorDynamic<>)
           CVar8.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = std::ostream::_M_insert<bool>;
  __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

ChVectorDynamic<> ChLinkPointPoint::GetConstraintViolation() const {
    ChVector<> res = mnodeA->GetPos() - mnodeB->GetPos();
    ChVectorN<double, 3> C;
    C(0) = res.x();
    C(1) = res.y();
    C(2) = res.z();
    return C;
}